

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::next_semiintersection
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
           *this)

{
  outer_range_iterator oVar1;
  reference pcVar2;
  reference pcVar3;
  iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
  *this_00;
  
  while( true ) {
    oVar1._M_current = (this->m_begin)._M_current;
    if (oVar1._M_current == (this->m_end)._M_current) {
      return;
    }
    oVar1 = skip_while_less(this,oVar1,oVar1._M_current + (this->m_min_items - 1));
    this_00 = (iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               *)((this->m_begin)._M_current + (this->m_min_items - 1));
    if ((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
         *)oVar1._M_current == this_00) break;
    if (((oVar1._M_current)->
        super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_node ==
        ((oVar1._M_current)->
        super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_node) {
      drop_empty_range(this,oVar1);
    }
    else {
      pcVar2 = boost::iterator_range_detail::
               iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ::front(this_00);
      pcVar3 = boost::iterator_range_detail::
               iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                        *)oVar1._M_current);
      if (*pcVar2 <= *pcVar3) {
        __assert_fail("m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0x103,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                     );
      }
      maintain_invariant(this);
    }
  }
  pcVar2 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                    *)oVar1._M_current);
  pcVar3 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                    *)((this->m_begin)._M_current + (this->m_min_items - 1)));
  if (*pcVar3 < *pcVar2) {
    __assert_fail("not m_compare(skipped_until->front(), semiintersection_candidate()->front())",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0xf9,
                  "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                 );
  }
  pcVar2 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                    *)((this->m_begin)._M_current + (this->m_min_items - 1)));
  pcVar3 = boost::iterator_range_detail::
           iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                    *)oVar1._M_current);
  if (*pcVar2 <= *pcVar3) {
    return;
  }
  __assert_fail("not m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0xfa,
                "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
               );
}

Assistant:

void next_semiintersection ()
        {
            while (not is_end())
            {
                auto skipped_until = skip_while_less(m_begin, semiintersection_candidate());
                if (skipped_until == semiintersection_candidate())
                {
                    BOOST_ASSERT(not m_compare(skipped_until->front(), semiintersection_candidate()->front()));
                    BOOST_ASSERT(not m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    break; // Полупересечение найдено.
                }
                else if (skipped_until->empty())
                {
                    drop_empty_range(skipped_until);
                }
                else // Текущий диапазон больше кандидата.
                {
                    BOOST_ASSERT(m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    maintain_invariant();
                }
            }
        }